

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_emwin.cc
# Opt level: O0

void __thiscall
EMWINHandler::EMWINHandler(EMWINHandler *this,Handler *config,shared_ptr<FileWriter> *fileWriter)

{
  shared_ptr<FileWriter> *in_RDI;
  Handler *in_stack_00000048;
  Handler *in_stack_00000050;
  shared_ptr<FileWriter> *in_stack_ffffffffffffffd8;
  
  Handler::Handler((Handler *)in_RDI);
  (in_RDI->super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR_handle_00374de0;
  Config::Handler::Handler(in_stack_00000050,in_stack_00000048);
  std::shared_ptr<FileWriter>::shared_ptr(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

EMWINHandler::EMWINHandler(
  const Config::Handler& config,
  const std::shared_ptr<FileWriter>& fileWriter)
  : config_(config),
    fileWriter_(fileWriter) {
}